

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_mbox.hpp
# Opt level: O2

void __thiscall
so_5::impl::local_mbox_details::subscriber_adaptive_container_t::subscriber_adaptive_container_t
          (subscriber_adaptive_container_t *this,subscriber_adaptive_container_t *o)

{
  pointer psVar1;
  
  this->m_storage = o->m_storage;
  psVar1 = (o->m_vector).
           super__Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->m_vector).
  super__Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (o->m_vector).
       super__Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->m_vector).
  super__Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
  ._M_impl.super__Vector_impl_data._M_finish = psVar1;
  (this->m_vector).
  super__Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (o->m_vector).
       super__Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (o->m_vector).
  super__Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (o->m_vector).
  super__Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)SUB168(ZEXT816(0) << 0x20,0);
  (o->m_vector).
  super__Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)SUB168(ZEXT816(0) << 0x20,8);
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->m_map)._M_t._M_impl.super__Rb_tree_header,
             &(o->m_map)._M_t._M_impl.super__Rb_tree_header);
  o->m_storage = vector;
  return;
}

Assistant:

subscriber_adaptive_container_t(
		subscriber_adaptive_container_t && o )
		:	m_storage{ o.m_storage }
		,	m_vector( std::move( o.m_vector ) )
		,	m_map( std::move( o.m_map ) )
		{
			// Other object is now empty.
			// It must use vector as a storage.
			o.m_storage = storage_type::vector;
		}